

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imglsadf.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  ostream *poVar4;
  InputSourceInterface *source;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_15;
  ostringstream error_message_14;
  ostringstream error_message_13;
  double signal;
  ostringstream error_message_12;
  Buffer buffer;
  InverseMglsaDigitalFilter filter;
  ostringstream error_message_11;
  InputSourceInterpolation interpolation;
  InputSourcePreprocessingForMelCepstrum preprocessing;
  double gamma;
  InputSourceFromStream input_source;
  vector<double,_std::allocator<double>_> filter_coefficients;
  int filter_length;
  istream *stream_for_filter_input;
  ostringstream error_message_10;
  ifstream ifs2;
  istream *stream_for_filter_coefficients;
  ostringstream error_message_9;
  ifstream ifs1;
  ostringstream error_message_8;
  ostringstream error_message_7;
  int num_input_files;
  char *filter_input_file;
  char *filter_coefficients_file;
  ostringstream error_message_6;
  ostringstream error_message_5;
  int max;
  int min;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool gain_flag;
  bool transposition_flag;
  int num_pade_order;
  int interpolation_period;
  int frame_period;
  int num_stage;
  double alpha;
  int num_filter_order;
  option *in_stack_ffffffffffffdbf8;
  Buffer *in_stack_ffffffffffffdc00;
  int in_stack_ffffffffffffdc08;
  undefined4 in_stack_ffffffffffffdc0c;
  InputSourceFromStream *in_stack_ffffffffffffdc10;
  undefined7 in_stack_ffffffffffffdc18;
  undefined1 in_stack_ffffffffffffdc1f;
  Buffer *in_stack_ffffffffffffdc20;
  allocator *paVar5;
  undefined6 in_stack_ffffffffffffdc28;
  undefined1 in_stack_ffffffffffffdc2e;
  undefined1 in_stack_ffffffffffffdc2f;
  undefined8 in_stack_ffffffffffffdc30;
  int num_stage_00;
  int in_stack_ffffffffffffdc38;
  int in_stack_ffffffffffffdc3c;
  InverseMglsaDigitalFilter *in_stack_ffffffffffffdc40;
  undefined1 in_stack_ffffffffffffdc4f;
  ostream *in_stack_ffffffffffffdc60;
  InputSourcePreprocessingForMelCepstrum *this;
  char *pcVar6;
  undefined7 in_stack_ffffffffffffdc70;
  undefined7 in_stack_ffffffffffffdcb0;
  InputSourceInterpolation *this_00;
  byte local_22ca;
  bool local_229a;
  bool local_2272;
  bool local_2242;
  byte local_221a;
  ostringstream *in_stack_ffffffffffffdde8;
  allocator *in_stack_ffffffffffffddf0;
  bool local_21ea;
  undefined1 local_21c9 [33];
  ostringstream local_21a8 [383];
  undefined1 local_2029 [33];
  ostringstream local_2008 [383];
  allocator local_1e89;
  string local_1e88 [32];
  ostringstream local_1e68 [391];
  allocator local_1ce1;
  string local_1ce0 [32];
  ostringstream local_1cc0 [536];
  InverseMglsaDigitalFilter local_1aa8;
  allocator local_1a41;
  string local_1a40 [32];
  ostringstream local_1a20 [376];
  InputSourceInterpolation local_18a8 [2];
  double local_17a8;
  undefined1 local_1779 [49];
  string local_1748 [32];
  ostringstream local_1728 [376];
  char local_15b0 [520];
  char *local_13a8;
  undefined4 local_13a0;
  allocator local_1399;
  string local_1398 [32];
  ostringstream local_1378 [376];
  char local_1200 [527];
  allocator local_ff1;
  string local_ff0 [32];
  ostringstream local_fd0 [383];
  allocator local_e51;
  string local_e50 [32];
  ostringstream local_e30 [380];
  int local_cb4;
  char *local_cb0;
  InputSourceInterpolation *local_ca8;
  allocator local_c99;
  string local_c98 [32];
  ostringstream local_c78 [383];
  allocator local_af9;
  string local_af8 [32];
  ostringstream local_ad8 [383];
  allocator local_959;
  string local_958 [36];
  undefined4 local_934;
  undefined4 local_930;
  allocator local_929;
  string local_928 [32];
  ostringstream local_908 [383];
  allocator local_789;
  string local_788 [39];
  allocator local_761;
  string local_760 [32];
  ostringstream local_740 [383];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [32];
  ostringstream local_578 [383];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  ostringstream local_3b0 [383];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  ostringstream local_1e8 [399];
  allocator local_59;
  string local_58 [32];
  int local_38;
  undefined1 local_32;
  undefined1 local_31;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  double local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_20 = 0.35;
  local_24 = 0;
  local_28 = 100;
  local_2c = 1;
  local_30 = 4;
  local_31 = 0;
  local_32 = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    local_38 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffdc10 >> 0x20),
                              (char **)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08)
                              ,(char *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8,
                              (int *)0x1038ac);
    pcVar6 = ya_optarg;
    num_stage_00 = (int)((ulong)in_stack_ffffffffffffdc30 >> 0x20);
    if (local_38 == -1) break;
    switch(local_38) {
    case 0x50:
      local_930 = 4;
      local_934 = 7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_958,pcVar6,&local_959);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                         (int *)in_stack_ffffffffffffdc00);
      local_22ca = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_30,4,7);
        local_22ca = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_958);
      std::allocator<char>::~allocator((allocator<char> *)&local_959);
      if ((local_22ca & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_ad8);
        poVar4 = std::operator<<((ostream *)local_ad8,
                                 "The argument for the -P option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,7);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_af8,"imglsadf",&local_af9);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string(local_af8);
        std::allocator<char>::~allocator((allocator<char> *)&local_af9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_ad8);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1bd4::PrintUsage(in_stack_ffffffffffffdc60);
      return 1;
    case 0x61:
      in_stack_ffffffffffffddf0 = &local_231;
      in_stack_ffffffffffffdde8 = (ostringstream *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_230,(char *)in_stack_ffffffffffffdde8,in_stack_ffffffffffffddf0);
      bVar1 = sptk::ConvertStringToDouble
                        ((string *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                         (double *)in_stack_ffffffffffffdc00);
      local_221a = 1;
      if (bVar1) {
        bVar1 = sptk::IsValidAlpha(local_20);
        local_221a = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      if ((local_221a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3b0);
        std::operator<<((ostream *)local_3b0,"The argument for the -a option must be in (-1.0, 1.0)"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3d0,"imglsadf",&local_3d1);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string(local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3b0);
        return local_4;
      }
      break;
    case 99:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,pcVar6,&local_3f9);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                         (int *)in_stack_ffffffffffffdc00);
      local_2242 = !bVar1 || local_24 < 0;
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      if (local_2242) {
        std::__cxx11::ostringstream::ostringstream(local_578);
        poVar4 = std::operator<<((ostream *)local_578,"The argument for the -c option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_598,"imglsadf",&local_599);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string(local_598);
        std::allocator<char>::~allocator((allocator<char> *)&local_599);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_578);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_1bd4::PrintUsage(in_stack_ffffffffffffdc60);
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,pcVar6,&local_789);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                         (int *)in_stack_ffffffffffffdc00);
      local_229a = !bVar1 || local_2c < 0;
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      if (local_229a) {
        std::__cxx11::ostringstream::ostringstream(local_908);
        poVar4 = std::operator<<((ostream *)local_908,"The argument for the -i option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_928,"imglsadf",&local_929);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string(local_928);
        std::allocator<char>::~allocator((allocator<char> *)&local_929);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_908);
        return local_4;
      }
      break;
    case 0x6b:
      local_32 = 0;
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar6,&local_59);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                         (int *)in_stack_ffffffffffffdc00);
      local_21ea = !bVar1 || local_14 < 0;
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      if (local_21ea) {
        std::__cxx11::ostringstream::ostringstream(local_1e8);
        poVar4 = std::operator<<((ostream *)local_1e8,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"imglsadf",&local_209);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e8);
        return local_4;
      }
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,pcVar6,&local_5c1);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                         (int *)in_stack_ffffffffffffdc00);
      local_2272 = !bVar1 || local_28 < 1;
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      if (local_2272) {
        std::__cxx11::ostringstream::ostringstream(local_740);
        std::operator<<((ostream *)local_740,
                        "The argument for the -p option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_760,"imglsadf",&local_761);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string(local_760);
        std::allocator<char>::~allocator((allocator<char> *)&local_761);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_740);
        return local_4;
      }
      break;
    case 0x74:
      local_31 = 1;
    }
  }
  if (local_28 / 2 < local_2c) {
    std::__cxx11::ostringstream::ostringstream(local_c78);
    poVar4 = std::operator<<((ostream *)local_c78,
                             "Interpolation period must be equal to or less than half ");
    std::operator<<(poVar4,"frame period");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c98,"imglsadf",&local_c99);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
    std::__cxx11::string::~string(local_c98);
    std::allocator<char>::~allocator((allocator<char> *)&local_c99);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c78);
    return local_4;
  }
  local_cb4 = local_8 - ya_optind;
  if (local_cb4 == 2) {
    local_ca8 = *(InputSourceInterpolation **)(local_10 + (long)(local_8 + -2) * 8);
    local_cb0 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_cb4 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_e30);
      std::operator<<((ostream *)local_e30,"Just two input files, mgcfile and infile, are required")
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e50,"imglsadf",&local_e51);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
      std::__cxx11::string::~string(local_e50);
      std::allocator<char>::~allocator((allocator<char> *)&local_e51);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_e30);
      return local_4;
    }
    local_ca8 = *(InputSourceInterpolation **)(local_10 + (long)(local_8 + -1) * 8);
    local_cb0 = (char *)0x0;
  }
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_fd0);
    std::operator<<((ostream *)local_fd0,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ff0,"imglsadf",&local_ff1);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
    std::__cxx11::string::~string(local_ff0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_fd0);
    return local_4;
  }
  std::ifstream::ifstream(local_1200);
  this_00 = local_ca8;
  _GLOBAL__N_1::std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_1200,(_Ios_Openmode)this_00);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1378);
    poVar4 = std::operator<<((ostream *)local_1378,"Cannot open file ");
    std::operator<<(poVar4,(char *)local_ca8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1398,"imglsadf",&local_1399);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
    std::__cxx11::string::~string(local_1398);
    std::allocator<char>::~allocator((allocator<char> *)&local_1399);
    local_4 = 1;
    local_13a0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1378);
    goto LAB_00105919;
  }
  local_13a8 = local_1200;
  std::ifstream::ifstream(local_15b0);
  pcVar6 = local_cb0;
  if (local_cb0 == (char *)0x0) {
LAB_00104f76:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      pcVar6 = (char *)&std::cin;
    }
    else {
      pcVar6 = local_15b0;
    }
    local_1779._29_4_ = local_14 + 1;
    source = (InputSourceInterface *)(long)(int)local_1779._29_4_;
    this = (InputSourcePreprocessingForMelCepstrum *)local_1779;
    local_1779._33_8_ = pcVar6;
    _GLOBAL__N_1::std::allocator<double>::allocator((allocator<double> *)0x104fec);
    _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdc20,
               CONCAT17(in_stack_ffffffffffffdc1f,in_stack_ffffffffffffdc18),
               (allocator_type *)in_stack_ffffffffffffdc10);
    _GLOBAL__N_1::std::allocator<double>::~allocator((allocator<double> *)0x105012);
    sptk::InputSourceFromStream::InputSourceFromStream
              (in_stack_ffffffffffffdc10,SUB41((uint)in_stack_ffffffffffffdc0c >> 0x18,0),
               in_stack_ffffffffffffdc08,(istream *)in_stack_ffffffffffffdc00);
    if (local_24 == 0) {
      local_17a8 = 0.0;
    }
    else {
      local_17a8 = -1.0 / (double)local_24;
    }
    anon_unknown.dwarf_1bd4::InputSourcePreprocessingForMelCepstrum::
    InputSourcePreprocessingForMelCepstrum
              (this,(double)source,local_17a8,(bool)in_stack_ffffffffffffdc4f,
               (InputSourceInterface *)in_stack_ffffffffffffdc40);
    sptk::InputSourceInterpolation::InputSourceInterpolation
              ((InputSourceInterpolation *)CONCAT17(bVar3,in_stack_ffffffffffffdc70),
               (int)((ulong)pcVar6 >> 0x20),(int)pcVar6,SUB81((ulong)this >> 0x38,0),source);
    bVar1 = sptk::InputSourceInterpolation::IsValid(local_18a8);
    if (bVar1) {
      sptk::InverseMglsaDigitalFilter::InverseMglsaDigitalFilter
                (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38,
                 num_stage_00,
                 (double)CONCAT17(in_stack_ffffffffffffdc2f,
                                  CONCAT16(in_stack_ffffffffffffdc2e,in_stack_ffffffffffffdc28)),
                 SUB81((ulong)in_stack_ffffffffffffdc20 >> 0x38,0));
      sptk::InverseMglsaDigitalFilter::Buffer::Buffer(in_stack_ffffffffffffdc20);
      bVar1 = sptk::InverseMglsaDigitalFilter::IsValid(&local_1aa8);
      if (bVar1) {
        do {
          bVar1 = sptk::ReadStream<double>
                            ((double *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08)
                             ,(istream *)in_stack_ffffffffffffdc00);
          if (!bVar1) {
            local_4 = 0;
            local_13a0 = 1;
            goto LAB_00105857;
          }
          bVar1 = sptk::InputSourceInterpolation::Get
                            (this_00,(vector<double,_std::allocator<double>_> *)
                                     CONCAT17(bVar2,in_stack_ffffffffffffdcb0));
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream(local_1e68);
            std::operator<<((ostream *)local_1e68,"Cannot get filter coefficients");
            paVar5 = &local_1e89;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e88,"imglsadf",paVar5);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
            std::__cxx11::string::~string(local_1e88);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e89);
            local_4 = 1;
            local_13a0 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1e68);
            goto LAB_00105857;
          }
          in_stack_ffffffffffffdc1f =
               sptk::InverseMglsaDigitalFilter::Run
                         ((InverseMglsaDigitalFilter *)
                          CONCAT17(in_stack_ffffffffffffdc1f,in_stack_ffffffffffffdc18),
                          (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdc10,
                          (double *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                          in_stack_ffffffffffffdc00);
          if (!(bool)in_stack_ffffffffffffdc1f) {
            std::__cxx11::ostringstream::ostringstream(local_2008);
            std::operator<<((ostream *)local_2008,"Failed to apply inverse MGLSA digital filter");
            in_stack_ffffffffffffdc10 = (InputSourceFromStream *)local_2029;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_2029 + 1),"imglsadf",(allocator *)in_stack_ffffffffffffdc10)
            ;
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
            std::__cxx11::string::~string((string *)(local_2029 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_2029);
            local_4 = 1;
            local_13a0 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_2008);
            goto LAB_00105857;
          }
          bVar1 = sptk::WriteStream<double>((double)in_stack_ffffffffffffdbf8,(ostream *)0x105714);
          in_stack_ffffffffffffdc0c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffdc0c);
        } while (bVar1);
        std::__cxx11::ostringstream::ostringstream(local_21a8);
        std::operator<<((ostream *)local_21a8,"Failed to write a filter output");
        in_stack_ffffffffffffdc00 = (Buffer *)local_21c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_21c9 + 1),"imglsadf",(allocator *)in_stack_ffffffffffffdc00);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string((string *)(local_21c9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_21c9);
        local_4 = 1;
        local_13a0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_21a8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1cc0);
        std::operator<<((ostream *)local_1cc0,"Failed to initialize InverseMglsaDigitalFilter");
        paVar5 = &local_1ce1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ce0,"imglsadf",paVar5);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        std::__cxx11::string::~string(local_1ce0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ce1);
        local_4 = 1;
        local_13a0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1cc0);
      }
LAB_00105857:
      sptk::InverseMglsaDigitalFilter::Buffer::~Buffer(in_stack_ffffffffffffdc00);
      sptk::InverseMglsaDigitalFilter::~InverseMglsaDigitalFilter
                ((InverseMglsaDigitalFilter *)0x105871);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a20);
      std::operator<<((ostream *)local_1a20,"Failed to initialize InputSource");
      paVar5 = &local_1a41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a40,"imglsadf",paVar5);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
      std::__cxx11::string::~string(local_1a40);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a41);
      local_4 = 1;
      local_13a0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1a20);
    }
    sptk::InputSourceInterpolation::~InputSourceInterpolation
              ((InputSourceInterpolation *)in_stack_ffffffffffffdc00);
    anon_unknown.dwarf_1bd4::InputSourcePreprocessingForMelCepstrum::
    ~InputSourcePreprocessingForMelCepstrum
              ((InputSourcePreprocessingForMelCepstrum *)in_stack_ffffffffffffdc00);
    sptk::InputSourceFromStream::~InputSourceFromStream((InputSourceFromStream *)0x1058b6);
    _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdc10);
  }
  else {
    _GLOBAL__N_1::std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_15b0,(_Ios_Openmode)pcVar6);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_00104f76;
    std::__cxx11::ostringstream::ostringstream(local_1728);
    poVar4 = std::operator<<((ostream *)local_1728,"Cannot open file ");
    std::operator<<(poVar4,local_cb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1748,"imglsadf",(allocator *)(local_1779 + 0x30));
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
    std::__cxx11::string::~string(local_1748);
    std::allocator<char>::~allocator((allocator<char> *)(local_1779 + 0x30));
    local_4 = 1;
    local_13a0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1728);
  }
  std::ifstream::~ifstream(local_15b0);
LAB_00105919:
  std::ifstream::~ifstream(local_1200);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  double alpha(kDefaultAlpha);
  int num_stage(kDefaultNumStage);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  int num_pade_order(kDefaultNumPadeOrder);
  bool transposition_flag(kDefaultTranspositionFlag);
  bool gain_flag(kDefaultGainFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:c:p:i:P:tkh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_stage) ||
            num_stage < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'P': {
        const int min(4);
        const int max(7);
        if (!sptk::ConvertStringToInteger(optarg, &num_pade_order) ||
            !sptk::IsInRange(num_pade_order, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -P option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        transposition_flag = true;
        break;
      }
      case 'k': {
        gain_flag = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, mgcfile and infile, are required";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  const double gamma((0 == num_stage) ? 0.0 : -1.0 / num_stage);
  InputSourcePreprocessingForMelCepstrum preprocessing(alpha, gamma, gain_flag,
                                                       &input_source);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &preprocessing);
  if (!interpolation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  sptk::InverseMglsaDigitalFilter filter(num_filter_order, num_pade_order,
                                         num_stage, alpha, transposition_flag);
  sptk::InverseMglsaDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InverseMglsaDigitalFilter";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!interpolation.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply inverse MGLSA digital filter";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }
  }

  return 0;
}